

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_lights.cxx
# Opt level: O3

void __thiscall
xray_re::xr_level_lights::load(xr_level_lights *this,uint32_t xrlc_version,xr_reader *r)

{
  xr_reader *local_18;
  
  if (xrlc_version == 9) {
    local_18 = xr_reader::open_chunk(r,8);
    if (local_18 == (xr_reader *)0x0) {
      __assert_fail("s",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level_lights.cxx"
                    ,0x51,"void xray_re::xr_level_lights::load(uint32_t, xr_reader &)");
    }
  }
  else {
    if (xrlc_version == 8) {
      local_18 = xr_reader::open_chunk(r,7);
      if (local_18 == (xr_reader *)0x0) {
        __assert_fail("s",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level_lights.cxx"
                      ,0x4c,"void xray_re::xr_level_lights::load(uint32_t, xr_reader &)");
      }
      load_v8(this,local_18);
      goto LAB_0016b6ce;
    }
    if (xrlc_version == 5) {
      local_18 = xr_reader::open_chunk(r,8);
      if (local_18 == (xr_reader *)0x0) {
        __assert_fail("s",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level_lights.cxx"
                      ,0x47,"void xray_re::xr_level_lights::load(uint32_t, xr_reader &)");
      }
      load_v5(this,local_18);
      goto LAB_0016b6ce;
    }
    local_18 = xr_reader::open_chunk(r,6);
    if (local_18 == (xr_reader *)0x0) {
      __assert_fail("s",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level_lights.cxx"
                    ,0x56,"void xray_re::xr_level_lights::load(uint32_t, xr_reader &)");
    }
  }
  load_v13(this,local_18);
LAB_0016b6ce:
  xr_reader::close_chunk(r,&local_18);
  return;
}

Assistant:

void xr_level_lights::load(uint32_t xrlc_version, xr_reader& r)
{
	xr_reader* s = 0;
	switch (xrlc_version) {
	case XRLC_VERSION_5:
		s = r.open_chunk(FSL5_LIGHT_DYNAMIC);
		xr_assert(s);
		load_v5(*s);
		break;
	case XRLC_VERSION_8:
		s = r.open_chunk(FSL8_LIGHT_DYNAMIC);
		xr_assert(s);
		load_v8(*s);
		break;
	case XRLC_VERSION_9:
		s = r.open_chunk(FSL9_LIGHT_DYNAMIC);
		xr_assert(s);
		load_v13(*s);
		break;
	default: //10+
		s = r.open_chunk(FSL13_LIGHT_DYNAMIC);
		xr_assert(s);
		load_v13(*s);
		break;
	}
	r.close_chunk(s);
}